

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletLeaveProximityEvent,unsigned_long,QPointingDevice_const*>
               (unsigned_long args,QPointingDevice *args_1)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  int *piVar5;
  long in_FS_OFFSET;
  WindowSystemEvent local_58;
  int *piStack_40;
  undefined8 local_38;
  unsigned_long uStack_30;
  undefined8 local_28;
  QPointingDevice *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::TabletLeaveProximityEvent,unsigned_long,QPointingDevice_const*>
              (args,args_1);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_00330687;
  }
  local_58.type = TabletLeaveProximity;
  local_58.flags = 2;
  local_58.eventAccepted = true;
  local_58._17_7_ = 0xaaaaaaaaaaaaaa;
  piStack_40 = (int *)0x0;
  local_38 = 0;
  local_28 = 0xaaaaaaaa00000000;
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d9120;
  uStack_30 = args;
  local_20 = args_1;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_58);
LAB_0033063a:
    uVar4 = local_58.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_58);
    if ((char)iVar3 != '\0') goto LAB_0033063a;
    uVar4 = 0;
  }
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d41f0;
  if (piStack_40 != (int *)0x0) {
    LOCK();
    *piStack_40 = *piStack_40 + -1;
    UNLOCK();
    if (*piStack_40 == 0) {
      piVar5 = piStack_40;
      if (piStack_40 == (int *)0x0) {
        piVar5 = (int *)0x0;
      }
      operator_delete(piVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar4;
  }
LAB_00330687:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}